

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86_avx.cpp
# Opt level: O3

void ncnn::dequantize(int *intptr,float *ptr,Mat *scale_data,Mat *bias_data,int elemcount,
                     int elempack)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  undefined8 uVar16;
  undefined1 auVar17 [16];
  byte bVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  int scale_data_size;
  uint uVar22;
  int iVar23;
  uint uVar24;
  undefined4 in_register_00000084;
  ushort uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined4 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  undefined1 auVar34 [32];
  undefined1 auVar37 [32];
  
  auVar26 = vpbroadcastd_avx512f(ZEXT416(*(uint *)&scale_data->data));
  auVar38 = auVar26._0_16_;
  uVar35 = auVar26._0_4_;
  auVar33._4_4_ = uVar35;
  auVar33._0_4_ = uVar35;
  auVar33._8_4_ = uVar35;
  auVar33._12_4_ = uVar35;
  auVar34._16_4_ = uVar35;
  auVar34._0_16_ = auVar33;
  auVar34._20_4_ = uVar35;
  auVar34._24_4_ = uVar35;
  auVar34._28_4_ = uVar35;
  if (1 < (int)bias_data) {
    if (in_stack_00000010 == 4) {
      auVar17._0_8_ = scale_data->data;
      auVar17._8_8_ = scale_data->refcount;
      auVar26 = vbroadcastf32x4_avx512f(auVar17);
      auVar33 = auVar26._0_16_;
      auVar34._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar33;
      auVar34._16_16_ = ZEXT116(0) * auVar26._16_16_ + ZEXT116(1) * auVar33;
      auVar26 = vmovdqa64_avx512f(auVar26);
    }
    else if (in_stack_00000010 == 8) {
      auVar15._0_8_ = scale_data->data;
      auVar15._8_8_ = scale_data->refcount;
      auVar15._16_8_ = scale_data->elemsize;
      auVar15._24_4_ = scale_data->elempack;
      auVar15._28_4_ = *(undefined4 *)&scale_data->field_0x1c;
      auVar26 = vbroadcastf64x4_avx512f(auVar15);
      auVar34 = auVar26._0_32_;
      auVar26 = vmovdqa64_avx512f(auVar26);
    }
    else if (in_stack_00000010 == 0x10) {
      auVar26._0_8_ = scale_data->data;
      auVar26._8_8_ = scale_data->refcount;
      auVar26._16_8_ = scale_data->elemsize;
      auVar26._24_4_ = scale_data->elempack;
      auVar26._28_4_ = *(undefined4 *)&scale_data->field_0x1c;
      auVar26._32_8_ = scale_data->allocator;
      auVar26._40_4_ = scale_data->dims;
      auVar26._44_4_ = scale_data->w;
      auVar26._48_4_ = scale_data->h;
      auVar26._52_4_ = scale_data->d;
      auVar26._56_4_ = scale_data->c;
      auVar26._60_4_ = *(undefined4 *)&scale_data->field_0x3c;
      auVar26 = vmovdqu64_avx512f(auVar26);
    }
  }
  uVar20 = in_stack_00000008 * in_stack_00000010;
  if (elempack == 0) {
    uVar22 = 0;
    if (0xf < (int)uVar20) {
      uVar22 = uVar20 & 0x7ffffff0;
      iVar23 = 0xf;
      do {
        auVar27 = vcvtdq2ps_avx512f(*(undefined1 (*) [64])intptr);
        auVar27 = vmulps_avx512f(auVar26,auVar27);
        *(undefined1 (*) [64])ptr = auVar27;
        intptr = (int *)((long)intptr + 0x40);
        ptr = (float *)((long)ptr + 0x40);
        iVar23 = iVar23 + 0x10;
      } while (iVar23 < (int)uVar20);
    }
    uVar24 = uVar22 | 7;
    while ((int)uVar24 < (int)uVar20) {
      auVar15 = vcvtdq2ps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])intptr);
      *(float *)*(undefined1 (*) [64])ptr = auVar34._0_4_ * auVar15._0_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 4) = auVar34._4_4_ * auVar15._4_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 8) = auVar34._8_4_ * auVar15._8_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 0xc) = auVar34._12_4_ * auVar15._12_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 0x10) = auVar34._16_4_ * auVar15._16_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 0x14) = auVar34._20_4_ * auVar15._20_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 0x18) = auVar34._24_4_ * auVar15._24_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 0x1c) = auVar15._28_4_;
      intptr = (int *)(*(undefined1 (*) [64])intptr + 0x20);
      ptr = (float *)((long)*(undefined1 (*) [64])ptr + 0x20);
      uVar24 = uVar22 + 0xf;
      uVar22 = uVar22 + 8;
    }
    uVar24 = uVar22 | 3;
    while ((int)uVar24 < (int)uVar20) {
      auVar17 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])intptr);
      *(float *)*(undefined1 (*) [64])ptr = auVar33._0_4_ * auVar17._0_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 4) = auVar33._4_4_ * auVar17._4_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 8) = auVar33._8_4_ * auVar17._8_4_;
      *(float *)((long)*(undefined1 (*) [64])ptr + 0xc) = auVar33._12_4_ * auVar17._12_4_;
      intptr = (int *)(*(undefined1 (*) [64])intptr + 0x10);
      ptr = (float *)((long)*(undefined1 (*) [64])ptr + 0x10);
      uVar24 = uVar22 + 7;
      uVar22 = uVar22 + 4;
    }
    if ((int)uVar20 <= (int)uVar22) {
      return;
    }
    auVar26 = vpbroadcastq_avx512f();
    auVar27 = vpbroadcastd_avx512f(auVar38);
    uVar21 = 0;
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vporq_avx512f(auVar30,auVar28);
      auVar30 = vporq_avx512f(auVar30,auVar29);
      uVar16 = vpcmpuq_avx512f(auVar30,auVar26,2);
      bVar18 = (byte)uVar16;
      uVar16 = vpcmpuq_avx512f(auVar31,auVar26,2);
      bVar19 = (byte)uVar16;
      uVar25 = CONCAT11(bVar19,bVar18);
      auVar31 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*(undefined1 (*) [64])intptr + uVar21 * 4))
      ;
      auVar30._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar31._4_4_;
      auVar30._0_4_ = (uint)(bVar18 & 1) * auVar31._0_4_;
      auVar30._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar31._8_4_;
      auVar30._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar31._12_4_;
      auVar30._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar31._16_4_;
      auVar30._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar31._20_4_;
      auVar30._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar31._24_4_;
      auVar30._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar31._28_4_;
      auVar30._32_4_ = (uint)(bVar19 & 1) * auVar31._32_4_;
      auVar30._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar31._36_4_;
      auVar30._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar31._40_4_;
      auVar30._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar31._44_4_;
      auVar30._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar31._48_4_;
      auVar30._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar31._52_4_;
      auVar30._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar31._56_4_;
      auVar30._60_4_ = (uint)(bVar19 >> 7) * auVar31._60_4_;
      auVar30 = vcvtdq2ps_avx512f(auVar30);
      auVar30 = vmulps_avx512f(auVar27,auVar30);
      pfVar1 = (float *)((long)*(undefined1 (*) [64])ptr + uVar21 * 4);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar19 >> 1 & 1);
      bVar10 = (bool)(bVar19 >> 2 & 1);
      bVar11 = (bool)(bVar19 >> 3 & 1);
      bVar12 = (bool)(bVar19 >> 4 & 1);
      bVar13 = (bool)(bVar19 >> 5 & 1);
      bVar14 = (bool)(bVar19 >> 6 & 1);
      *pfVar1 = (float)((uint)(bVar18 & 1) * auVar30._0_4_ |
                       (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar2 * auVar30._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar3 * auVar30._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar4 * auVar30._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar5 * auVar30._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar30._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar30._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar8 * auVar30._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar30._32_4_ |
                         (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar9 * auVar30._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar10 * auVar30._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar11 * auVar30._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar12 * auVar30._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar13 * auVar30._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar14 * auVar30._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar30._60_4_ |
                           (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
      uVar21 = uVar21 + 0x10;
    } while (((ulong)(uVar20 + ~uVar22) + 0x10 & 0xfffffffffffffff0) != uVar21);
    return;
  }
  auVar27 = vpbroadcastd_avx512f(ZEXT416(*(uint *)CONCAT44(in_register_00000084,elemcount)));
  uVar35 = auVar27._0_4_;
  auVar36._4_4_ = uVar35;
  auVar36._0_4_ = uVar35;
  auVar36._8_4_ = uVar35;
  auVar36._12_4_ = uVar35;
  auVar37._16_4_ = uVar35;
  auVar37._0_16_ = auVar36;
  auVar37._20_4_ = uVar35;
  auVar37._24_4_ = uVar35;
  auVar37._28_4_ = uVar35;
  if (1 < elempack) {
    if (in_stack_00000010 == 4) {
      auVar28 = vbroadcastf32x4_avx512f
                          (*(undefined1 (*) [16])CONCAT44(in_register_00000084,elemcount));
      auVar36 = auVar28._0_16_;
      auVar37._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar36;
      auVar37._16_16_ = ZEXT116(0) * auVar28._16_16_ + ZEXT116(1) * auVar36;
      auVar28 = vmovdqa64_avx512f(auVar28);
      goto LAB_004534c1;
    }
    if (in_stack_00000010 == 8) {
      auVar28 = vbroadcastf64x4_avx512f
                          (*(undefined1 (*) [32])CONCAT44(in_register_00000084,elemcount));
      auVar37 = auVar28._0_32_;
      auVar28 = vmovdqa64_avx512f(auVar28);
      goto LAB_004534c1;
    }
    if (in_stack_00000010 == 0x10) {
      auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])CONCAT44(in_register_00000084,elemcount));
      goto LAB_004534c1;
    }
  }
  auVar28 = vmovdqa64_avx512f(auVar27);
LAB_004534c1:
  uVar22 = 0;
  if (0xf < (int)uVar20) {
    uVar22 = uVar20 & 0x7ffffff0;
    iVar23 = 0xf;
    do {
      auVar29 = vcvtdq2ps_avx512f(*(undefined1 (*) [64])intptr);
      auVar29 = vfmadd213ps_avx512f(auVar29,auVar26,auVar28);
      *(undefined1 (*) [64])ptr = auVar29;
      intptr = (int *)((long)intptr + 0x40);
      ptr = (float *)((long)ptr + 0x40);
      iVar23 = iVar23 + 0x10;
    } while (iVar23 < (int)uVar20);
  }
  uVar24 = uVar22 | 7;
  while ((int)uVar24 < (int)uVar20) {
    auVar15 = vcvtdq2ps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])intptr);
    auVar17 = vfmadd213ps_fma(auVar15,auVar34,auVar37);
    *(undefined1 (*) [32])*(undefined1 (*) [64])ptr = ZEXT1632(auVar17);
    intptr = (int *)(*(undefined1 (*) [64])intptr + 0x20);
    ptr = (float *)((long)*(undefined1 (*) [64])ptr + 0x20);
    uVar24 = uVar22 + 0xf;
    uVar22 = uVar22 + 8;
  }
  uVar24 = uVar22 | 3;
  while ((int)uVar24 < (int)uVar20) {
    auVar17 = vcvtdq2ps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])intptr);
    auVar17 = vfmadd213ps_fma(auVar17,auVar33,auVar36);
    *(undefined1 (*) [16])*(undefined1 (*) [64])ptr = auVar17;
    intptr = (int *)(*(undefined1 (*) [64])intptr + 0x10);
    ptr = (float *)((long)*(undefined1 (*) [64])ptr + 0x10);
    uVar24 = uVar22 + 7;
    uVar22 = uVar22 + 4;
  }
  if ((int)uVar22 < (int)uVar20) {
    auVar26 = vpbroadcastq_avx512f();
    auVar28 = vpbroadcastd_avx512f(auVar38);
    auVar27 = vpbroadcastd_avx512f(auVar27._0_16_);
    uVar21 = 0;
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar31 = vpbroadcastq_avx512f();
      auVar32 = vporq_avx512f(auVar31,auVar29);
      auVar31 = vporq_avx512f(auVar31,auVar30);
      uVar16 = vpcmpuq_avx512f(auVar31,auVar26,2);
      bVar18 = (byte)uVar16;
      uVar16 = vpcmpuq_avx512f(auVar32,auVar26,2);
      bVar19 = (byte)uVar16;
      uVar25 = CONCAT11(bVar19,bVar18);
      auVar32 = vmovdqu32_avx512f(*(undefined1 (*) [64])(*(undefined1 (*) [64])intptr + uVar21 * 4))
      ;
      auVar31._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar32._4_4_;
      auVar31._0_4_ = (uint)(bVar18 & 1) * auVar32._0_4_;
      auVar31._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar32._8_4_;
      auVar31._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar32._12_4_;
      auVar31._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar32._16_4_;
      auVar31._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar32._20_4_;
      auVar31._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar32._24_4_;
      auVar31._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar32._28_4_;
      auVar31._32_4_ = (uint)(bVar19 & 1) * auVar32._32_4_;
      auVar31._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar32._36_4_;
      auVar31._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar32._40_4_;
      auVar31._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar32._44_4_;
      auVar31._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar32._48_4_;
      auVar31._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar32._52_4_;
      auVar31._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar32._56_4_;
      auVar31._60_4_ = (uint)(bVar19 >> 7) * auVar32._60_4_;
      auVar31 = vcvtdq2ps_avx512f(auVar31);
      auVar31 = vfmadd213ps_avx512f(auVar31,auVar28,auVar27);
      pfVar1 = (float *)((long)*(undefined1 (*) [64])ptr + uVar21 * 4);
      bVar2 = (bool)((byte)(uVar25 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar25 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar25 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar25 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
      bVar8 = (bool)((byte)(uVar25 >> 7) & 1);
      bVar9 = (bool)(bVar19 >> 1 & 1);
      bVar10 = (bool)(bVar19 >> 2 & 1);
      bVar11 = (bool)(bVar19 >> 3 & 1);
      bVar12 = (bool)(bVar19 >> 4 & 1);
      bVar13 = (bool)(bVar19 >> 5 & 1);
      bVar14 = (bool)(bVar19 >> 6 & 1);
      *pfVar1 = (float)((uint)(bVar18 & 1) * auVar31._0_4_ |
                       (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar2 * auVar31._4_4_ | (uint)!bVar2 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar3 * auVar31._8_4_ | (uint)!bVar3 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar4 * auVar31._12_4_ | (uint)!bVar4 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar5 * auVar31._16_4_ | (uint)!bVar5 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar6 * auVar31._20_4_ | (uint)!bVar6 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar7 * auVar31._24_4_ | (uint)!bVar7 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar8 * auVar31._28_4_ | (uint)!bVar8 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar31._32_4_ |
                         (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar9 * auVar31._36_4_ | (uint)!bVar9 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar10 * auVar31._40_4_ | (uint)!bVar10 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar11 * auVar31._44_4_ | (uint)!bVar11 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar12 * auVar31._48_4_ | (uint)!bVar12 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar13 * auVar31._52_4_ | (uint)!bVar13 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar14 * auVar31._56_4_ | (uint)!bVar14 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar31._60_4_ |
                           (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
      uVar21 = uVar21 + 0x10;
    } while (((ulong)(uVar20 + ~uVar22) + 0x10 & 0xfffffffffffffff0) != uVar21);
  }
  return;
}

Assistant:

static void dequantize(const int* intptr, float* ptr, const Mat& scale_data, const Mat& bias_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int bias_data_size = bias_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("dequantize %d %d   %d %d", scale_data_size, bias_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale;
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
            }
#endif // __AVX__
            if (elempack == 4)
            {
                _bias = _mm_loadu_ps((const float*)bias_data);
#if __AVX__
                _bias_avx = combine4x2_ps(_bias, _bias);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_avx512, _bias_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_avx, _bias_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale, _bias);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale + bias;
            intptr++;
            ptr++;
        }
    }
}